

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_entry_extract(zip_t *zip,_func_size_t_void_ptr_uint64_t_void_ptr_size_t *on_extract,
                     void *arg)

{
  long lVar1;
  mz_bool mVar2;
  int iVar3;
  
  if (zip == (zip_t *)0x0) {
    return -1;
  }
  iVar3 = -3;
  if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) && (lVar1 = (zip->entry).index, -1 < lVar1)
     ) {
    mVar2 = mz_zip_reader_extract_to_callback
                      (&zip->archive,(mz_uint)lVar1,(mz_file_write_func)on_extract,arg,0);
    iVar3 = -10;
    if (mVar2 != 0) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int zip_entry_extract(struct zip_t *zip,
                      size_t (*on_extract)(void *arg, uint64_t offset,
                                           const void *buf, size_t bufsize),
                      void *arg) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;

  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return ZIP_ENOENT;
  }

  idx = (mz_uint)zip->entry.index;
  return (mz_zip_reader_extract_to_callback(pzip, idx, on_extract, arg, 0))
             ? 0
             : ZIP_EINVIDX;
}